

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O3

bool __thiscall slang::syntax::SyntaxNode::isEquivalentTo(SyntaxNode *this,SyntaxNode *other)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  SyntaxNode *this_00;
  SyntaxNode *other_00;
  size_t __n;
  size_type __rlen;
  string_view sVar5;
  string_view sVar6;
  Token lt;
  Token rt;
  Token local_50;
  Token local_40;
  
  sVar3 = getChildCount(this);
  if ((this->kind == other->kind) && (sVar4 = getChildCount(other), sVar3 == sVar4)) {
    if (sVar3 == 0) {
      return true;
    }
    sVar4 = 0;
    while( true ) {
      this_00 = childNode(this,sVar4);
      other_00 = childNode(other,sVar4);
      if ((this_00 != (SyntaxNode *)0x0) == (other_00 == (SyntaxNode *)0x0)) break;
      if (this_00 == (SyntaxNode *)0x0) {
        local_50 = childToken(this,sVar4);
        local_40 = childToken(other,sVar4);
        if ((local_40.info != (Info *)0x0) != (local_50.info != (Info *)0x0)) {
          return false;
        }
        if (local_50.info != (Info *)0x0) {
          if (local_50.kind != local_40.kind) {
            return false;
          }
          sVar5 = parsing::Token::valueText(&local_50);
          __n = sVar5._M_len;
          sVar6 = parsing::Token::valueText(&local_40);
          if (__n != sVar6._M_len) {
            return false;
          }
          if ((__n != 0) && (iVar2 = bcmp(sVar5._M_str,sVar6._M_str,__n), iVar2 != 0)) {
            return false;
          }
        }
      }
      else {
        bVar1 = isEquivalentTo(this_00,other_00);
        if (!bVar1) {
          return false;
        }
      }
      sVar4 = sVar4 + 1;
      if (sVar3 == sVar4) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SyntaxNode::isEquivalentTo(const SyntaxNode& other) const {
    size_t childCount = getChildCount();
    if (kind != other.kind || childCount != other.getChildCount())
        return false;

    for (size_t i = 0; i < childCount; i++) {
        auto ln = childNode(i);
        auto rn = other.childNode(i);
        if (bool(ln) != bool(rn))
            return false;

        if (ln) {
            if (!ln->isEquivalentTo(*rn))
                return false;
        }
        else {
            Token lt = childToken(i);
            Token rt = other.childToken(i);
            if (bool(lt) != bool(rt))
                return false;

            if (lt) {
                if (lt.kind != rt.kind || lt.valueText() != rt.valueText())
                    return false;
            }
        }
    }
    return true;
}